

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O1

string * __thiscall
deqp::gls::DrawTestSpec::drawMethodToString_abi_cxx11_
          (string *__return_storage_ptr__,DrawTestSpec *this,DrawMethod method)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             _ZZN4deqp3gls12DrawTestSpec18drawMethodToStringB5cxx11ENS1_10DrawMethodEE7methods_rel +
             *(int *)(
                     _ZZN4deqp3gls12DrawTestSpec18drawMethodToStringB5cxx11ENS1_10DrawMethodEE7methods_rel
                     + (long)(int)this * 4),&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string DrawTestSpec::drawMethodToString (DrawTestSpec::DrawMethod method)
{
	static const char* methods[] =
	{
		"draw_arrays",							//!< DRAWMETHOD_DRAWARRAYS
		"draw_arrays_instanced",				//!< DRAWMETHOD_DRAWARRAYS_INSTANCED
		"draw_arrays_indirect",					//!< DRAWMETHOD_DRAWARRAYS_INDIRECT
		"draw_elements",						//!< DRAWMETHOD_DRAWELEMENTS
		"draw_range_elements",					//!< DRAWMETHOD_DRAWELEMENTS_RANGED
		"draw_elements_instanced",				//!< DRAWMETHOD_DRAWELEMENTS_INSTANCED
		"draw_elements_indirect",				//!< DRAWMETHOD_DRAWELEMENTS_INDIRECT
		"draw_elements_base_vertex",			//!< DRAWMETHOD_DRAWELEMENTS_BASEVERTEX,
		"draw_elements_instanced_base_vertex",	//!< DRAWMETHOD_DRAWELEMENTS_INSTANCED_BASEVERTEX,
		"draw_range_elements_base_vertex",		//!< DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX,
	};

	return de::getSizedArrayElement<DrawTestSpec::DRAWMETHOD_LAST>(methods, (int)method);
}